

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_add_sample(bcf_hdr_t *h,char *s)

{
  khint_t kVar1;
  kh_vdict_t *h_00;
  bcf_idinfo_t *pbVar2;
  khint_t kVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char **ppcVar6;
  int ret;
  
  pcVar5 = s;
  if (s != (char *)0x0) {
    while (*pcVar5 == '\0') {
      ppuVar4 = __ctype_b_loc();
      pcVar5 = pcVar5 + 1;
      if ((**ppuVar4 & 0x2000) == 0) {
        fprintf(_stderr,"[E::%s] Empty sample name: trailing spaces/tabs in the header line?\n",
                "bcf_hdr_add_sample");
        abort();
      }
    }
    h_00 = (kh_vdict_t *)h->dict[2];
    pcVar5 = strdup(s);
    kVar3 = kh_put_vdict(h_00,pcVar5,&ret);
    if (ret == 0) {
      if (hts_verbose < 2) {
        free(pcVar5);
        return -1;
      }
      fprintf(_stderr,"[E::%s] Duplicated sample name \'%s\'\n","bcf_hdr_add_sample",s);
      abort();
    }
    pbVar2 = h_00->vals;
    pbVar2[(int)kVar3].hrec[2] = (bcf_hrec_t *)0x0;
    (pbVar2[(int)kVar3].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
    pbVar2[(int)kVar3].hrec[0] = (bcf_hrec_t *)0x0;
    pbVar2[(int)kVar3].hrec[1] = (bcf_hrec_t *)0x0;
    pbVar2 = pbVar2 + (int)kVar3;
    pbVar2->info[0] = 0xf;
    pbVar2->info[1] = 0xf;
    *(undefined8 *)(pbVar2->info + 2) = 0xf;
    kVar1 = h_00->size;
    h_00->vals[(int)kVar3].id = kVar1 - 1;
    ppcVar6 = (char **)realloc(h->samples,(long)(int)kVar1 * 8);
    h->samples = ppcVar6;
    ppcVar6[(long)(int)kVar1 + -1] = pcVar5;
    h->dirty = 1;
  }
  return 0;
}

Assistant:

int bcf_hdr_add_sample(bcf_hdr_t *h, const char *s)
{
    if ( !s ) return 0;

    const char *ss = s;
    while ( !*ss && isspace(*ss) ) ss++;
    if ( !*ss )
    {
        fprintf(stderr,"[E::%s] Empty sample name: trailing spaces/tabs in the header line?\n", __func__);
        abort();
    }

    vdict_t *d = (vdict_t*)h->dict[BCF_DT_SAMPLE];
    int ret;
    char *sdup = strdup(s);
    int k = kh_put(vdict, d, sdup, &ret);
    if (ret) { // absent
        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = kh_size(d) - 1;
    } else {
        if (hts_verbose >= 2)
        {
            fprintf(stderr, "[E::%s] Duplicated sample name '%s'\n", __func__, s);
            abort();
        }
        free(sdup);
        return -1;
    }
    int n = kh_size(d);
    h->samples = (char**) realloc(h->samples,sizeof(char*)*n);
    h->samples[n-1] = sdup;
    h->dirty = 1;
    return 0;
}